

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall Shader::fragment(Shader *this,Model *model,vec3f bar,TGAColor *color)

{
  undefined1 auVar1 [16];
  int i;
  TGAColor TVar2;
  vec<3UL,_double> *pvVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  bool bVar8;
  double ret_3;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  TGAColor c;
  vec<4UL,_double> ret_2;
  vec3f l;
  vec<3UL,_double> ret_11;
  vec3f n;
  vec2f uv;
  vec<3UL,_double> local_118;
  double dStack_100;
  vec<3UL,_double> local_f8;
  double dStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  vec<3UL,_double> local_b8;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  vec3f local_78;
  vec<3UL,_double> local_58;
  vec2f local_40;
  
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_118.z = 0.0;
  lVar6 = 0;
  do {
    dVar9 = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_tri).rows[2].x + lVar6),&bar)
    ;
    lVar5 = 0;
    if (lVar6 != -0x30) {
      lVar5 = (ulong)(lVar6 != -0x18) * 8 + 8;
    }
    *(double *)((long)&local_118.x + lVar5) = dVar9;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x48);
  local_f8.z = 0.0;
  dStack_e0 = 0.0;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  sVar7 = 3;
  do {
    dVar9 = 1.0;
    if (sVar7 + 1 < 4) {
      dVar9 = vec<3UL,_double>::operator[](&local_118,sVar7);
    }
    (&local_f8.x)[sVar7] = dVar9;
    bVar8 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar8);
  local_c8 = ZEXT816(0);
  local_d8 = ZEXT816(0);
  pdVar4 = (this->uniform_Mshadow).rows[3].data + 3;
  lVar6 = 4;
  do {
    lVar6 = lVar6 + -1;
    dVar9 = 0.0;
    lVar5 = 0;
    do {
      dVar9 = dVar9 + pdVar4[lVar5] * *(double *)(local_d8 + lVar5 * 8 + -8);
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    *(double *)(local_d8 + lVar6 * 8) = dVar9;
    pdVar4 = pdVar4 + -4;
  } while (lVar6 != 0);
  auVar11._8_4_ = local_c8._8_4_;
  auVar11._0_8_ = local_c8._8_8_;
  auVar11._12_4_ = local_c8._12_4_;
  auVar11 = divpd(local_c8,auVar11);
  auVar1._8_4_ = local_c8._8_4_;
  auVar1._0_8_ = local_c8._8_8_;
  auVar1._12_4_ = local_c8._12_4_;
  local_d8 = divpd(local_d8,auVar1);
  local_c8 = auVar11;
  dVar9 = DepthBuffer::get(this->shadow_buffer,(long)(int)(double)local_d8._0_8_,
                           (long)(int)(double)local_d8._8_8_);
  local_98 = (double)(-(ulong)(dVar9 <= (double)local_c8._0_8_ + 43.34) & 0x3ff0000000000000);
  uStack_90 = 0;
  lVar6 = 0;
  local_40.x = 0.0;
  do {
    dVar9 = local_40.x;
    local_40.x = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_uv).rows[1].x + lVar6),
                                 &bar);
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x30);
  local_40.y = dVar9;
  Model::normal(&local_78,model,&local_40);
  pvVar3 = vec<3UL,_double>::normalize(&local_78);
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_118.z = 0.0;
  dStack_100 = 0.0;
  sVar7 = 3;
  do {
    dVar9 = 1.0;
    if (sVar7 + 1 < 4) {
      dVar9 = vec<3UL,_double>::operator[](pvVar3,sVar7);
    }
    (&local_118.x)[sVar7] = dVar9;
    bVar8 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar8);
  local_f8.z = 0.0;
  dStack_e0 = 0.0;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  pdVar4 = (this->uniform_MIT).rows[3].data + 3;
  lVar6 = 4;
  do {
    lVar6 = lVar6 + -1;
    dVar9 = 0.0;
    lVar5 = 0;
    do {
      dVar9 = dVar9 + pdVar4[lVar5] * (&dStack_100)[lVar5];
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    *(double *)((long)&local_f8 + lVar6 * 8) = dVar9;
    pdVar4 = pdVar4 + -4;
  } while (lVar6 != 0);
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 0.0;
  lVar6 = 3;
  do {
    lVar5 = (ulong)(lVar6 != 2) * 8 + 8;
    if (lVar6 == 1) {
      lVar5 = 0;
    }
    *(double *)((long)&local_b8.x + lVar5) = (&dStack_100)[lVar6];
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  pvVar3 = vec<3UL,_double>::normalize(&local_b8);
  local_58.x = pvVar3->x;
  local_58.y = pvVar3->y;
  local_58.z = pvVar3->z;
  local_118.z = 0.0;
  dStack_100 = 0.0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  sVar7 = 3;
  do {
    dVar9 = 1.0;
    if (sVar7 + 1 < 4) {
      dVar9 = vec<3UL,_double>::operator[](&light_dir,sVar7);
    }
    (&local_118.x)[sVar7] = dVar9;
    bVar8 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar8);
  local_f8.z = 0.0;
  dStack_e0 = 0.0;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  pdVar4 = (this->uniform_M).rows[3].data + 3;
  lVar6 = 4;
  do {
    lVar6 = lVar6 + -1;
    dVar9 = 0.0;
    lVar5 = 0;
    do {
      dVar9 = dVar9 + pdVar4[lVar5] * (&dStack_100)[lVar5];
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    *(double *)((long)&local_f8 + lVar6 * 8) = dVar9;
    pdVar4 = pdVar4 + -4;
  } while (lVar6 != 0);
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.z = 0.0;
  lVar6 = 3;
  do {
    lVar5 = (ulong)(lVar6 != 2) * 8 + 8;
    if (lVar6 == 1) {
      lVar5 = 0;
    }
    *(double *)((long)&local_78.x + lVar5) = (&dStack_100)[lVar6];
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  pvVar3 = vec<3UL,_double>::normalize(&local_78);
  local_b8.x = pvVar3->x;
  local_b8.y = pvVar3->y;
  local_b8.z = pvVar3->z;
  dVar9 = dot<3ul,double>(&local_58,&local_b8);
  local_118.x = local_58.x;
  local_118.y = local_58.y;
  local_118.z = local_58.z;
  lVar6 = -1;
  do {
    lVar5 = (ulong)(lVar6 != 0) * 8 + 8;
    if (lVar6 == 1) {
      lVar5 = 0;
    }
    *(double *)((long)&local_118.x + lVar5) =
         *(double *)((long)&local_118.x + lVar5) * (dVar9 + dVar9);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  local_f8.z = local_118.z;
  local_f8.x = local_118.x;
  local_f8.y = local_118.y;
  lVar6 = 3;
  do {
    dVar9 = vec<3UL,_double>::operator[](&local_b8,lVar6 - 1);
    lVar5 = (ulong)(lVar6 != 2) * 8 + 8;
    if (lVar6 == 1) {
      lVar5 = 0;
    }
    *(double *)((long)&local_f8.x + lVar5) = *(double *)((long)&local_f8.x + lVar5) - dVar9;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  local_98 = local_98 * 0.7 + 0.3;
  pvVar3 = vec<3UL,_double>::normalize(&local_f8);
  dVar9 = 0.0;
  if (0.0 <= pvVar3->z) {
    dVar9 = pvVar3->z;
  }
  dVar10 = Model::specular(model,&local_40);
  dVar9 = pow(dVar9,dVar10);
  local_80 = dot<3ul,double>(&local_58,&local_b8);
  if (local_80 <= 0.0) {
    local_80 = 0.0;
  }
  TVar2 = Model::diffuse(model,&local_40);
  local_f8.x = (double)CONCAT35(local_f8.x._5_3_,TVar2);
  lVar6 = 0;
  do {
    dVar10 = (double)*(byte *)((long)&local_f8.x + lVar6) * local_98 *
             (local_80 * 1.2 + dVar9 * 0.6) + 20.0;
    dVar12 = 255.0;
    if (dVar10 <= 255.0) {
      dVar12 = dVar10;
    }
    color->bgra[lVar6] = (uint8_t)(int)dVar12;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec4f sb_p = uniform_Mshadow *
                     embed<4>(varying_tri * bar);  // corresponding point in the shadow buffer
        sb_p = sb_p / sb_p[3];
        double shadow = .3 + .7 * (shadow_buffer.get(int(sb_p[0]), int(sb_p[1])) <=
                                   sb_p[2] + 43.34);  // magic coeff to avoid z-fighting
        // shadow = std::max(0., shadow);

        // shadow = .7 * shadow_buffer.get(int(sb_p[0]), int(sb_p[1]));
        vec2f uv = varying_uv * bar;  // interpolate uv for the current pixel
        vec3f n =
            proj<3>(uniform_MIT * embed<4>(model.normal(uv).normalize())).normalize();  // normal
        vec3f l = proj<3>(uniform_M * embed<4>(light_dir)).normalize();  // light vector
        vec3f r = (n * (dot(n, l) * 2.) - l).normalize();                // reflected light
        double spec = std::pow(std::max(r.z, 0.0), model.specular(uv));
        double diff = std::max(0., dot(n, l));
        TGAColor c = model.diffuse(uv);
        for (int i = 0; i < 3; i++) {
            color[i] =
                static_cast<uint8_t>(std::min(20 + c[i] * shadow * (1.2 * diff + .6 * spec), 255.));
            // color[i] = (uint8_t)(model.specular(uv) + 64);
        }

        return false;
    }